

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O3

void __thiscall iu_UtilTest_x_iutest_x_Find_Test::Body(iu_UtilTest_x_iutest_x_Find_Test *this)

{
  long lVar1;
  int iVar2;
  UnitTest *pUVar3;
  TestInfo *val;
  uint uVar4;
  ulong uVar5;
  TestSuite *pTVar6;
  AssertionResult iutest_ar;
  TestInfo *in_stack_fffffffffffffde8;
  _Alloc_hider in_stack_fffffffffffffdf0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  bool local_1f0;
  AssertionHelper local_1e8;
  undefined1 local_1b8 [392];
  
  pUVar3 = iutest::UnitTest::instance();
  uVar4 = (uint)((ulong)((long)(pUVar3->super_UnitTestImpl).m_testsuites.
                               super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pUVar3->super_UnitTestImpl).m_testsuites.
                              super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if (0 < (int)uVar4) {
    uVar5 = 0;
    do {
      pUVar3 = iutest::UnitTest::instance();
      pTVar6 = (pUVar3->super_UnitTestImpl).m_testsuites.
               super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>._M_impl
               .super__Vector_impl_data._M_start[uVar5];
      iVar2 = strcmp((pTVar6->m_testsuite_name)._M_dataplus._M_p,"UtilTest");
      if (iVar2 == 0) goto LAB_001320bc;
      uVar5 = uVar5 + 1;
    } while ((uVar4 & 0x7fffffff) != uVar5);
  }
  pTVar6 = (TestSuite *)0x0;
LAB_001320bc:
  iutest::internal::NullHelper<false>::CompareNe<iutest::TestSuite>
            ((AssertionResult *)&stack0xfffffffffffffdf0,"(testsuite)",pTVar6);
  if (local_1f0 == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,in_stack_fffffffffffffdf0._M_p,
               (allocator<char> *)&stack0xfffffffffffffdef);
    local_1e8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp";
    local_1e8.m_part_result.super_iuCodeMessage.m_line = 0x17;
    local_1e8.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_1e8,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)in_stack_fffffffffffffdf0._M_p != &local_200) {
    operator_delete(in_stack_fffffffffffffdf0._M_p,local_200._M_allocated_capacity + 1);
  }
  pUVar3 = iutest::UnitTest::instance();
  uVar4 = (uint)((ulong)((long)(pUVar3->super_UnitTestImpl).m_testsuites.
                               super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pUVar3->super_UnitTestImpl).m_testsuites.
                              super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if ((int)uVar4 < 1) goto LAB_0013221a;
  val = (TestInfo *)0x0;
  uVar5 = 0;
  do {
    pUVar3 = iutest::UnitTest::instance();
    pTVar6 = (pUVar3->super_UnitTestImpl).m_testsuites.
             super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>._M_impl.
             super__Vector_impl_data._M_start[uVar5];
    iVar2 = strcmp((pTVar6->m_testsuite_name)._M_dataplus._M_p,"UtilTest");
    if (iVar2 == 0) {
      lVar1 = *(long *)&(pTVar6->m_testinfos).
                        super__Vector_base<iutest::TestInfo_*,_std::allocator<iutest::TestInfo_*>_>.
                        _M_impl.super__Vector_impl_data;
      uVar4 = (uint)((ulong)((long)*(pointer *)
                                    ((long)&(pTVar6->m_testinfos).
                                            super__Vector_base<iutest::TestInfo_*,_std::allocator<iutest::TestInfo_*>_>
                                            ._M_impl + 8) - lVar1) >> 3);
      if ((int)uVar4 < 1) goto LAB_0013221a;
      uVar5 = 0;
      goto LAB_001321ff;
    }
    uVar5 = uVar5 + 1;
  } while ((uVar4 & 0x7fffffff) != uVar5);
  goto LAB_0013221c;
  while (uVar5 = uVar5 + 1, (uVar4 & 0x7fffffff) != uVar5) {
LAB_00132476:
    iVar2 = strcmp((char *)**(undefined8 **)(lVar1 + uVar5 * 8),"FindXXX");
    if (iVar2 == 0) break;
  }
  goto LAB_00132493;
  while (uVar5 = uVar5 + 1, (uVar4 & 0x7fffffff) != uVar5) {
LAB_001325d3:
    iVar2 = strcmp((char *)**(undefined8 **)(lVar1 + uVar5 * 8),"Find");
    if (iVar2 == 0) break;
  }
  goto LAB_001325f0;
  while (uVar5 = uVar5 + 1, (uVar4 & 0x7fffffff) != uVar5) {
LAB_001321ff:
    val = *(TestInfo **)(lVar1 + uVar5 * 8);
    iVar2 = strcmp((val->m_testname)._M_dataplus._M_p,"Find");
    if (iVar2 == 0) goto LAB_0013221c;
  }
LAB_0013221a:
  val = (TestInfo *)0x0;
LAB_0013221c:
  iutest::internal::NullHelper<false>::CompareNe<iutest::TestInfo>
            ((AssertionResult *)&stack0xfffffffffffffdf0,
             "(::iuutil::FindTestInfo(\"UtilTest\", \"Find\"))",val);
  if (local_1f0 == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,in_stack_fffffffffffffdf0._M_p,
               (allocator<char> *)&stack0xfffffffffffffdef);
    local_1e8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp";
    local_1e8.m_part_result.super_iuCodeMessage.m_line = 0x18;
    local_1e8.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_1e8,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)in_stack_fffffffffffffdf0._M_p != &local_200) {
    operator_delete(in_stack_fffffffffffffdf0._M_p,local_200._M_allocated_capacity + 1);
  }
  pUVar3 = iutest::UnitTest::instance();
  uVar4 = (uint)((ulong)((long)(pUVar3->super_UnitTestImpl).m_testsuites.
                               super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pUVar3->super_UnitTestImpl).m_testsuites.
                              super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if (0 < (int)uVar4) {
    uVar5 = 0;
    do {
      pUVar3 = iutest::UnitTest::instance();
      iVar2 = strcmp(((pUVar3->super_UnitTestImpl).m_testsuites.
                      super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar5]->m_testsuite_name)._M_dataplus
                     ._M_p,"UtilTestXXX");
      if (iVar2 == 0) break;
      uVar5 = uVar5 + 1;
    } while ((uVar4 & 0x7fffffff) != uVar5);
  }
  iutest::internal::NullHelper<false>::CompareEq<iutest::TestSuite>
            (in_stack_fffffffffffffdf0._M_p,(TestSuite *)in_stack_fffffffffffffde8);
  if (local_1f0 == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,in_stack_fffffffffffffdf0._M_p,
               (allocator<char> *)&stack0xfffffffffffffdef);
    local_1e8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp";
    local_1e8.m_part_result.super_iuCodeMessage.m_line = 0x1d;
    local_1e8.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_1e8,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)in_stack_fffffffffffffdf0._M_p != &local_200) {
    operator_delete(in_stack_fffffffffffffdf0._M_p,local_200._M_allocated_capacity + 1);
  }
  pUVar3 = iutest::UnitTest::instance();
  uVar4 = (uint)((ulong)((long)(pUVar3->super_UnitTestImpl).m_testsuites.
                               super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pUVar3->super_UnitTestImpl).m_testsuites.
                              super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if (0 < (int)uVar4) {
    uVar5 = 0;
    do {
      pUVar3 = iutest::UnitTest::instance();
      pTVar6 = (pUVar3->super_UnitTestImpl).m_testsuites.
               super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>._M_impl
               .super__Vector_impl_data._M_start[uVar5];
      iVar2 = strcmp((pTVar6->m_testsuite_name)._M_dataplus._M_p,"UtilTest");
      if (iVar2 == 0) {
        lVar1 = *(long *)&(pTVar6->m_testinfos).
                          super__Vector_base<iutest::TestInfo_*,_std::allocator<iutest::TestInfo_*>_>
                          ._M_impl.super__Vector_impl_data;
        uVar4 = (uint)((ulong)((long)*(pointer *)
                                      ((long)&(pTVar6->m_testinfos).
                                              super__Vector_base<iutest::TestInfo_*,_std::allocator<iutest::TestInfo_*>_>
                                              ._M_impl + 8) - lVar1) >> 3);
        if (0 < (int)uVar4) {
          uVar5 = 0;
          goto LAB_00132476;
        }
        break;
      }
      uVar5 = uVar5 + 1;
    } while ((uVar4 & 0x7fffffff) != uVar5);
  }
LAB_00132493:
  iutest::internal::NullHelper<false>::CompareEq<iutest::TestInfo>
            (in_stack_fffffffffffffdf0._M_p,in_stack_fffffffffffffde8);
  if (local_1f0 == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,in_stack_fffffffffffffdf0._M_p,
               (allocator<char> *)&stack0xfffffffffffffdef);
    local_1e8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp";
    local_1e8.m_part_result.super_iuCodeMessage.m_line = 0x22;
    local_1e8.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_1e8,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)in_stack_fffffffffffffdf0._M_p != &local_200) {
    operator_delete(in_stack_fffffffffffffdf0._M_p,local_200._M_allocated_capacity + 1);
  }
  pUVar3 = iutest::UnitTest::instance();
  uVar4 = (uint)((ulong)((long)(pUVar3->super_UnitTestImpl).m_testsuites.
                               super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pUVar3->super_UnitTestImpl).m_testsuites.
                              super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if (0 < (int)uVar4) {
    uVar5 = 0;
    do {
      pUVar3 = iutest::UnitTest::instance();
      pTVar6 = (pUVar3->super_UnitTestImpl).m_testsuites.
               super__Vector_base<iutest::TestSuite_*,_std::allocator<iutest::TestSuite_*>_>._M_impl
               .super__Vector_impl_data._M_start[uVar5];
      iVar2 = strcmp((pTVar6->m_testsuite_name)._M_dataplus._M_p,"UtilTestXXX");
      if (iVar2 == 0) {
        lVar1 = *(long *)&(pTVar6->m_testinfos).
                          super__Vector_base<iutest::TestInfo_*,_std::allocator<iutest::TestInfo_*>_>
                          ._M_impl.super__Vector_impl_data;
        uVar4 = (uint)((ulong)((long)*(pointer *)
                                      ((long)&(pTVar6->m_testinfos).
                                              super__Vector_base<iutest::TestInfo_*,_std::allocator<iutest::TestInfo_*>_>
                                              ._M_impl + 8) - lVar1) >> 3);
        if (0 < (int)uVar4) {
          uVar5 = 0;
          goto LAB_001325d3;
        }
        break;
      }
      uVar5 = uVar5 + 1;
    } while ((uVar4 & 0x7fffffff) != uVar5);
  }
LAB_001325f0:
  iutest::internal::NullHelper<false>::CompareEq<iutest::TestInfo>
            (in_stack_fffffffffffffdf0._M_p,in_stack_fffffffffffffde8);
  if (local_1f0 == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e8,in_stack_fffffffffffffdf0._M_p,
               (allocator<char> *)&stack0xfffffffffffffdef);
    local_1e8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/util_tests.cpp";
    local_1e8.m_part_result.super_iuCodeMessage.m_line = 0x23;
    local_1e8.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_1e8,(Fixed *)local_1b8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1e8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1e8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)in_stack_fffffffffffffdf0._M_p != &local_200) {
    operator_delete(in_stack_fffffffffffffdf0._M_p,local_200._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST_P(ParamTest, Test)
{
}